

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O1

int compression_end_deflate(archive *a,la_zstream *lastrm)

{
  z_streamp strm;
  int iVar1;
  
  strm = (z_streamp)lastrm->real_stream;
  iVar1 = cm_zlib_deflateEnd(strm);
  free(strm);
  lastrm->real_stream = (void *)0x0;
  lastrm->valid = 0;
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    archive_set_error(a,-1,"Failed to clean up compressor");
    iVar1 = -0x1e;
  }
  return iVar1;
}

Assistant:

static int
compression_end_deflate(struct archive *a, struct la_zstream *lastrm)
{
	z_stream *strm;
	int r;

	strm = (z_stream *)lastrm->real_stream;
	r = deflateEnd(strm);
	free(strm);
	lastrm->real_stream = NULL;
	lastrm->valid = 0;
	if (r != Z_OK) {
		archive_set_error(a, ARCHIVE_ERRNO_MISC,
		    "Failed to clean up compressor");
		return (ARCHIVE_FATAL);
	}
	return (ARCHIVE_OK);
}